

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FeatureDescription::FeatureDescription(FeatureDescription *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureDescription_003b9168;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (FeatureDescription *)&_FeatureDescription_default_instance_) {
    protobuf_Model_2eproto::InitDefaults();
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->shortdescription_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->type_ = (FeatureType *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

FeatureDescription::FeatureDescription()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Model_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.FeatureDescription)
}